

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O3

void __thiscall monotonic_state::~monotonic_state(monotonic_state *this)

{
  float fVar1;
  
  fVar1 = (float)this->source_rate / (float)this->target_rate;
  if (((this->monotonic == true) && (this->max_value != 0)) && (this->max_value != this->max_step))
  {
    printf("%s is monotonically increasing, max: %zu, max_step: %zu, in: %dHz, out: %dHz, block_size: %d, ratio: %lf\n"
           ,(double)fVar1,this->what);
  }
  if (0x14 < this->max_value) {
    printf("%s, unexpected large max buffering value, max: %zu, max_step: %zu, in: %dHz, out: %dHz, block_size: %d, ratio: %lf\n"
           ,(double)fVar1,this->what,this->max_value,this->max_step,(ulong)(uint)this->source_rate,
           (ulong)(uint)this->target_rate,this->block_size);
  }
  return;
}

Assistant:

~monotonic_state()
  {
    float ratio =
        static_cast<float>(source_rate) / static_cast<float>(target_rate);
    // Only report if there has been a meaningful increase in buffering. Do
    // not warn if the buffering was constant and small.
    if (monotonic && max_value && max_value != max_step) {
      printf("%s is monotonically increasing, max: %zu, max_step: %zu, "
             "in: %dHz, out: "
             "%dHz, block_size: %d, ratio: %lf\n",
             what, max_value, max_step, source_rate, target_rate, block_size,
             ratio);
    }
    // Arbitrary limit: if more than this number of frames has been buffered,
    // print a message.
    constexpr int BUFFER_SIZE_THRESHOLD = 20;
    if (max_value > BUFFER_SIZE_THRESHOLD) {
      printf("%s, unexpected large max buffering value, max: %zu, max_step: "
             "%zu, in: %dHz, out: %dHz, block_size: %d, ratio: %lf\n",
             what, max_value, max_step, source_rate, target_rate, block_size,
             ratio);
    }
  }